

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O2

void __thiscall TimerManager::addTimer(TimerManager *this,Timer *timer)

{
  Timer **ppTVar1;
  ulong uVar2;
  AutoLock l;
  Timer *local_30;
  AutoLock local_28;
  
  local_30 = timer;
  AutoLock::AutoLock(&local_28,&this->mMutex);
  uVar2 = 0;
  do {
    if ((this->mTimers).mSize == uVar2) {
      JetHead::vector<Timer_*>::push_back(&this->mTimers,&local_30);
      break;
    }
    ppTVar1 = (this->mTimers).mData + uVar2;
    uVar2 = uVar2 + 1;
  } while (*ppTVar1 != timer);
  AutoLock::~AutoLock(&local_28);
  return;
}

Assistant:

void TimerManager::addTimer(Timer* timer)
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	// Lock mutex while accessing/modifying mTimers vector
	AutoLock l(mMutex);
	
	// Search the vector of timers to see if the specified
	// timer is already present.   If it is then return
	// immediately.
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		if (mTimers[i] == timer)
		{
			// Timer already in our vector so nothing to do
			return;
		}
	}
	
	mTimers.push_back(timer);
}